

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void wtree_per(wtree_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  double *local_70;
  long local_68;
  long local_60;
  ulong local_50;
  
  if (0 < len_cA) {
    uVar2 = *(uint *)(wt->ext + 4);
    uVar5 = (int)uVar2 / 2;
    lVar8 = (long)N;
    iVar3 = N % 2;
    lVar10 = (long)(int)uVar5;
    local_70 = inp + lVar8 + lVar10;
    local_50 = lVar10 - lVar8;
    local_68 = 0;
    uVar9 = 0;
    local_60 = lVar10;
    do {
      cA[uVar9] = 0.0;
      cD[uVar9] = 0.0;
      if (0 < (int)uVar2) {
        uVar7 = 0;
        pdVar4 = local_70;
        lVar6 = local_68;
        do {
          lVar11 = (lVar10 + uVar9 * 2) - uVar7;
          lVar1 = lVar10 + lVar6;
          if ((lVar1 < lVar8 && lVar10 <= lVar1) || (uVar5 + (int)lVar6 < uVar5)) {
            dVar13 = *(double *)(*(long *)&wt->cfftset + uVar7 * 8);
LAB_00103fab:
            pdVar12 = inp + lVar11;
LAB_00103fb3:
            cA[uVar9] = dVar13 * *pdVar12 + cA[uVar9];
            cD[uVar9] = *(double *)(*(long *)wt->length + uVar7 * 8) * *pdVar12 + cD[uVar9];
          }
          else {
            if ((iVar3 == 0) && (lVar1 < 0)) {
              dVar13 = *(double *)(*(long *)&wt->cfftset + uVar7 * 8);
              pdVar12 = pdVar4;
              goto LAB_00103fb3;
            }
            if ((iVar3 == 1) && (lVar1 < 0)) {
              dVar13 = *(double *)(*(long *)&wt->cfftset + uVar7 * 8);
              pdVar12 = pdVar4 + 1;
              if (local_60 + 1U == uVar7) {
                pdVar12 = inp + lVar8 + -1;
              }
              goto LAB_00103fb3;
            }
            if ((iVar3 == 0) && (lVar8 <= lVar1)) {
              dVar13 = *(double *)(*(long *)&wt->cfftset + uVar7 * 8);
              lVar11 = lVar11 - lVar8;
              goto LAB_00103fab;
            }
            if ((iVar3 == 1) && (lVar8 <= lVar1)) {
              dVar13 = *(double *)(*(long *)&wt->cfftset + uVar7 * 8);
              pdVar12 = inp + lVar8 + -1;
              if (local_50 != uVar7) {
                pdVar12 = inp + (int)(~N + uVar5 + (int)lVar6);
              }
              goto LAB_00103fb3;
            }
          }
          uVar7 = uVar7 + 1;
          pdVar4 = pdVar4 + -1;
          lVar6 = lVar6 + -1;
        } while (uVar2 != uVar7);
      }
      uVar9 = uVar9 + 1;
      local_70 = local_70 + 2;
      local_50 = local_50 + 2;
      local_60 = local_60 + 2;
      local_68 = local_68 + 2;
    } while (uVar9 != (uint)len_cA);
  }
  return;
}

Assistant:

static void wtree_per(wtree_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int l, l2, isodd, i, t, len_avg;

	len_avg = wt->wave->lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0 && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l + N];
				cD[i] += wt->wave->hpd[l] * inp[t - l + N];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					cA[i] += wt->wave->lpd[l] * inp[t - l + N + 1];
					cD[i] += wt->wave->hpd[l] * inp[t - l + N + 1];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l - N];
				cD[i] += wt->wave->hpd[l] * inp[t - l - N];
			}
			else if ((t - l) >= N && isodd == 1) {
				if (t - l != N) {
					cA[i] += wt->wave->lpd[l] * inp[t - l - (N + 1)];
					cD[i] += wt->wave->hpd[l] * inp[t - l - (N + 1)];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}

		}
	}



}